

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DisabledFilesystemsSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  FileSystem *pFVar1;
  InternalException *this;
  allocator local_71;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> list
  ;
  string local_38;
  
  if (db != (DatabaseInstance *)0x0) {
    pFVar1 = FileSystem::GetFileSystem(db);
    Value::ToString_abi_cxx11_(&local_70,input);
    ::std::__cxx11::string::string((string *)&local_38,",",&local_71);
    StringUtil::Split(&list,(string *)&local_70,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_70);
    (*pFVar1->_vptr_FileSystem[0x28])(pFVar1,&list);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&list);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_70,"disabled_filesystems can only be set in an active database",
             (allocator *)&local_38);
  InternalException::InternalException(this,(string *)&local_70);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void DisabledFilesystemsSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	if (!db) {
		throw InternalException("disabled_filesystems can only be set in an active database");
	}
	auto &fs = FileSystem::GetFileSystem(*db);
	auto list = StringUtil::Split(input.ToString(), ",");
	fs.SetDisabledFileSystems(list);
}